

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_server_socket.c
# Opt level: O0

void test_init_setsockopt_fails(void)

{
  cio_error cVar1;
  undefined1 local_550 [4];
  cio_error err;
  cio_server_socket ss;
  cio_eventloop loop;
  
  setsockopt_fake.custom_fake = setsockopt_fails;
  alloc_client_fake.custom_fake = alloc_success;
  free_client_fake.custom_fake = free_success;
  cVar1 = cio_server_socket_init
                    ((cio_server_socket *)local_550,(cio_eventloop *)&ss.free_client,5,
                     CIO_ADDRESS_FAMILY_INET4,alloc_client,free_client,10,on_close);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Initialization of server socket failed!",0x247,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_set_reuse_address((cio_server_socket *)local_550,true);
  if (cVar1 != CIO_SUCCESS) {
    UnityAssertEqualNumber(0,(ulong)close_fake.call_count,(char *)0x0,0x24b,UNITY_DISPLAY_STYLE_INT)
    ;
    cio_server_socket_close((cio_server_socket *)local_550);
    UnityAssertEqualNumber(1,(ulong)close_fake.call_count,(char *)0x0,0x24d,UNITY_DISPLAY_STYLE_INT)
    ;
    return;
  }
  UnityFail(" Expression Evaluated To FALSE",0x24a);
}

Assistant:

static void test_init_setsockopt_fails(void)
{
	setsockopt_fake.custom_fake = setsockopt_fails;

	struct cio_eventloop loop;
	struct cio_server_socket ss;

	alloc_client_fake.custom_fake = alloc_success;
	free_client_fake.custom_fake = free_success;

	enum cio_error err = cio_server_socket_init(&ss, &loop, 5, CIO_ADDRESS_FAMILY_INET4, alloc_client, free_client, 10, on_close);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Initialization of server socket failed!");

	err = cio_server_socket_set_reuse_address(&ss, true);
	TEST_ASSERT(err != CIO_SUCCESS);
	TEST_ASSERT_EQUAL(0, close_fake.call_count);
	cio_server_socket_close(&ss);
	TEST_ASSERT_EQUAL(1, close_fake.call_count);
}